

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O2

void read_random(void)

{
  istream *piVar1;
  double r;
  ifstream ifi_r;
  
  std::ifstream::ifstream(&ifi_r,"random.txt",_S_in);
  while( true ) {
    piVar1 = std::istream::_M_extract<double>((double *)&ifi_r);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<double,_std::allocator<double>_>::push_back(&random_,&r);
  }
  std::ifstream::~ifstream(&ifi_r);
  return;
}

Assistant:

void read_random() {
	ifstream ifi_r("random.txt");
	double r;
	while(ifi_r >> r)random_.push_back(r);
}